

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_wbmp.c
# Opt level: O0

gdImagePtr gdImageCreateFromWBMPPtr(int size,void *data)

{
  gdIOCtx *infile;
  gdIOCtx *in;
  gdImagePtr im;
  void *data_local;
  gdImagePtr pgStack_10;
  int size_local;
  
  infile = gdNewDynamicCtxEx(size,data,0);
  if (infile == (gdIOCtx *)0x0) {
    pgStack_10 = (gdImagePtr)0x0;
  }
  else {
    pgStack_10 = gdImageCreateFromWBMPCtx(infile);
    (*infile->gd_free)(infile);
  }
  return pgStack_10;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromWBMPPtr(int size, void *data)
{
	gdImagePtr im;
	gdIOCtx *in = gdNewDynamicCtxEx(size, data, 0);
	if(!in) {
		return 0;
	}
	im = gdImageCreateFromWBMPCtx(in);
	in->gd_free(in);
	return im;
}